

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::CpgotoTable::CpgotoTable(CpgotoTable *this,Span *span,uint32_t nSpans)

{
  State **ppSVar1;
  uint local_24;
  uint local_20;
  uint32_t i;
  uint32_t c;
  uint32_t nSpans_local;
  Span *span_local;
  CpgotoTable *this_local;
  
  ppSVar1 = (State **)operator_new__(0x800);
  this->table = ppSVar1;
  local_20 = 0;
  for (local_24 = 0; local_24 < nSpans; local_24 = local_24 + 1) {
    for (; local_20 < span[local_24].ub && local_20 < 0x100; local_20 = local_20 + 1) {
      this->table[local_20] = span[local_24].to;
    }
  }
  return;
}

Assistant:

CpgotoTable::CpgotoTable (const Span * span, uint32_t nSpans)
	: table (new const State * [TABLE_SIZE])
{
	uint32_t c = 0;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		for(; c < span[i].ub && c < TABLE_SIZE; ++c)
		{
			table[c] = span[i].to;
		}
	}
}